

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsio.c
# Opt level: O0

CONCRETE_IO_HANDLE wsio_create(void *io_create_parameters)

{
  LOGGER_LOG p_Var1;
  UWS_CLIENT_HANDLE pUVar2;
  SINGLYLINKEDLIST_HANDLE pSVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  WS_PROTOCOL protocols;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  WSIO_INSTANCE *result;
  WSIO_CONFIG *ws_io_config;
  void *io_create_parameters_local;
  
  if ((((io_create_parameters == (void *)0x0) || (*(long *)((long)io_create_parameters + 0x10) == 0)
       ) || (*(long *)((long)io_create_parameters + 0x20) == 0)) ||
     (*(long *)((long)io_create_parameters + 0x28) == 0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                ,"wsio_create",0xd9,1,"NULL io_create_parameters.");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)calloc(1,0x58);
    if (l == (LOGGER_LOG)0x0) {
      protocols.protocol = (char *)xlogging_get_log_function();
      if ((LOGGER_LOG)protocols.protocol != (LOGGER_LOG)0x0) {
        (*(code *)protocols.protocol)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                   ,"wsio_create",0xe3,1,"Cannot allocate memory for the new WSIO instance.");
      }
    }
    else {
      l_2 = *(LOGGER_LOG *)((long)io_create_parameters + 0x28);
      *(undefined8 *)l = 0;
      *(undefined8 *)(l + 8) = 0;
      *(undefined8 *)(l + 0x10) = 0;
      *(undefined8 *)(l + 0x18) = 0;
      *(undefined8 *)(l + 0x20) = 0;
      *(undefined8 *)(l + 0x28) = 0;
      *(undefined8 *)(l + 0x30) = 0;
      *(undefined8 *)(l + 0x38) = 0;
      pUVar2 = uws_client_create_with_io
                         (*io_create_parameters,*(void **)((long)io_create_parameters + 8),
                          *(char **)((long)io_create_parameters + 0x10),
                          *(uint *)((long)io_create_parameters + 0x18),
                          *(char **)((long)io_create_parameters + 0x20),(WS_PROTOCOL *)&l_2,1);
      *(UWS_CLIENT_HANDLE *)(l + 0x50) = pUVar2;
      if (*(long *)(l + 0x50) == 0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                    ,"wsio_create",0x100,1,"Cannot create uws instance.");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        pSVar3 = singlylinkedlist_create();
        *(SINGLYLINKEDLIST_HANDLE *)(l + 0x48) = pSVar3;
        if (*(long *)(l + 0x48) == 0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                      ,"wsio_create",0x10b,1,"Cannot create singly linked list.");
          }
          uws_client_destroy(*(UWS_CLIENT_HANDLE *)(l + 0x50));
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          *(undefined4 *)(l + 0x40) = 0;
        }
      }
    }
  }
  return l;
}

Assistant:

CONCRETE_IO_HANDLE wsio_create(void* io_create_parameters)
{
    /* Codes_SRS_WSIO_01_066: [ io_create_parameters shall be used as a WSIO_CONFIG* . ]*/
    WSIO_CONFIG* ws_io_config = (WSIO_CONFIG*)io_create_parameters;
    WSIO_INSTANCE* result;

    /* Codes_SRS_WSIO_01_065: [ If the argument io_create_parameters is NULL then wsio_create shall return NULL. ]*/
    if ((ws_io_config == NULL) ||
        /* Codes_SRS_WSIO_01_067: [ If any of the members hostname, resource_name or protocol is NULL in WSIO_CONFIG then wsio_create shall return NULL. ]*/
        (ws_io_config->hostname == NULL) ||
        (ws_io_config->resource_name == NULL) ||
        (ws_io_config->protocol == NULL))
    {
        LogError("NULL io_create_parameters.");
        result = NULL;
    }
    else
    {
        /* Codes_SRS_WSIO_01_001: [wsio_create shall create an instance of wsio and return a non-NULL handle to it.] */
        result = (WSIO_INSTANCE*)calloc(1, sizeof(WSIO_INSTANCE));
        if (result == NULL)
        {
            /* Codes_SRS_WSIO_01_068: [ If allocating memory for the new wsio instance fails then wsio_create shall return NULL. ]*/
            LogError("Cannot allocate memory for the new WSIO instance.");
        }
        else
        {
            WS_PROTOCOL protocols;

            protocols.protocol = ws_io_config->protocol;

            result->on_bytes_received = NULL;
            result->on_bytes_received_context = NULL;
            result->on_io_open_complete = NULL;
            result->on_io_open_complete_context = NULL;
            result->on_io_error = NULL;
            result->on_io_error_context = NULL;
            result->on_io_close_complete = NULL;
            result->on_io_close_complete_context = NULL;

            /* Codes_SRS_WSIO_01_070: [ The underlying uws instance shall be created by calling uws_client_create_with_io. ]*/
            /* Codes_SRS_WSIO_01_071: [ The arguments for uws_client_create_with_io shall be: ]*/
            /* Codes_SRS_WSIO_01_185: [ - underlying_io_interface shall be set to the underlying_io_interface field in the io_create_parameters passed to wsio_create. ]*/
            /* Codes_SRS_WSIO_01_186: [ - underlying_io_parameters shall be set to the underlying_io_parameters field in the io_create_parameters passed to wsio_create. ]*/
            /* Codes_SRS_WSIO_01_072: [ - hostname set to the hostname field in the io_create_parameters passed to wsio_create. ]*/
            /* Codes_SRS_WSIO_01_130: [ - port set to the port field in the io_create_parameters passed to wsio_create. ]*/
            /* Codes_SRS_WSIO_01_128: [ - resource_name set to the resource_name field in the io_create_parameters passed to wsio_create. ]*/
            /* Codes_SRS_WSIO_01_129: [ - protocols shall be filled with only one structure, that shall have the protocol set to the value of the protocol field in the io_create_parameters passed to wsio_create. ]*/
            result->uws = uws_client_create_with_io(ws_io_config->underlying_io_interface, ws_io_config->underlying_io_parameters, ws_io_config->hostname, ws_io_config->port, ws_io_config->resource_name, &protocols, 1);
            if (result->uws == NULL)
            {
                /* Codes_SRS_WSIO_01_075: [ If uws_client_create_with_io fails, then wsio_create shall fail and return NULL. ]*/
                LogError("Cannot create uws instance.");
                free(result);
                result = NULL;
            }
            else
            {
                /* Codes_SRS_WSIO_01_076: [ wsio_create shall create a pending send IO list that is to be used to queue send packets by calling singlylinkedlist_create. ]*/
                result->pending_io_list = singlylinkedlist_create();
                if (result->pending_io_list == NULL)
                {
                    /* Codes_SRS_WSIO_01_077: [ If singlylinkedlist_create fails then wsio_create shall fail and return NULL. ]*/
                    LogError("Cannot create singly linked list.");
                    uws_client_destroy(result->uws);
                    free(result);
                    result = NULL;
                }
                else
                {
                    result->io_state = IO_STATE_NOT_OPEN;
                }
            }
        }
    }

    return result;
}